

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_parser.h
# Opt level: O3

bool __thiscall
cppcms::impl::multipart_parser::set_content_type(multipart_parser *this,content_type *content_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  file *this_00;
  string bkey;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"boundary","");
  http::content_type::parameter_by_key(&local_40,content_type,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40._M_string_length != 0) {
    std::operator+(&local_60,"\r\n--",&local_40);
    std::__cxx11::string::operator=((string *)&this->boundary_,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->crlfcrlf_,0,(char *)(this->crlfcrlf_)._M_string_length,0x246ec1);
    this->position_ = 2;
    this->state_ = expecting_first_boundary;
    this_00 = (file *)operator_new(0x450);
    http::file::file(this_00);
    std::__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>::reset<cppcms::http::file>
              (&(this->file_).super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>,
               this_00);
    http::file::set_temporary_directory
              ((this->file_).super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->temp_dir_);
    if ((long)this->memory_limit_ != 0xffffffffffffffff) {
      http::file::set_memory_limit
                ((this->file_).super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(long)this->memory_limit_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return local_40._M_string_length != 0;
}

Assistant:

bool set_content_type(http::content_type const &content_type)
			{
				std::string bkey = content_type.parameter_by_key("boundary");
				if(bkey.empty())
					return false;
				boundary_ = "\r\n--" + bkey;
				crlfcrlf_ = "\r\n\r\n";
				position_ = 2; // First CRLF does not appear if first state
				state_ = expecting_first_boundary;
				file_.reset(new http::file());
				file_->set_temporary_directory(temp_dir_);
				if(memory_limit_ != -1) {
					file_->set_memory_limit(memory_limit_);
				}
				return true;
			}